

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

option_group_definition * __thiscall
VW::config::option_group_definition::add<float>
          (option_group_definition *this,typed_option<float> *op)

{
  option_group_definition *in_RDI;
  value_type *in_stack_ffffffffffffff98;
  typed_option<float> *in_stack_ffffffffffffffc8;
  
  std::make_shared<VW::config::typed_option<float>,VW::config::typed_option<float>&>
            (in_stack_ffffffffffffffc8);
  std::shared_ptr<VW::config::base_option>::shared_ptr<VW::config::typed_option<float>,void>
            ((shared_ptr<VW::config::base_option> *)in_RDI,
             (shared_ptr<VW::config::typed_option<float>_> *)in_stack_ffffffffffffff98);
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::push_back((vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
               *)in_RDI,in_stack_ffffffffffffff98);
  std::shared_ptr<VW::config::base_option>::~shared_ptr
            ((shared_ptr<VW::config::base_option> *)0x13902f);
  std::shared_ptr<VW::config::typed_option<float>_>::~shared_ptr
            ((shared_ptr<VW::config::typed_option<float>_> *)0x139039);
  return in_RDI;
}

Assistant:

option_group_definition& add(typed_option<T> op)
  {
    m_options.push_back(std::make_shared<typed_option<T>>(op));
    return *this;
  }